

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void av1_resize_and_extend_frame_ssse3
               (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,InterpFilter filter,int phase,
               int num_planes)

{
  int iVar1;
  int iVar2;
  __m128i c0c1_00;
  __m128i c0c1_01;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  int in_ECX;
  undefined1 in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  uint8_t *in_stack_00000008;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  ptrdiff_t in_stack_00000020;
  uint8_t *in_stack_00000028;
  ptrdiff_t in_stack_00000030;
  InterpKernel *interp_kernel_3;
  uint8_t *temp_buffer_3;
  InterpKernel *interp_kernel_2;
  uint8_t *temp_buffer_2;
  int buffer_size;
  int extra_padding_1;
  int buffer_height_2;
  int buffer_stride_ver;
  int buffer_stride_hor;
  InterpKernel *interp_kernel_1;
  uint8_t *temp_buffer_1;
  int extra_padding;
  int buffer_height_1;
  int buffer_stride_1;
  __m128i c0c1_1;
  int16_t c1_1;
  int16_t c0_1;
  InterpKernel *interp_kernel;
  uint8_t *temp_buffer;
  int buffer_height;
  int buffer_stride;
  __m128i c0c1;
  int16_t *in_stack_000000d0;
  int16_t c1;
  uint8_t *in_stack_000000d8;
  int16_t c0;
  int dst_y_h;
  int dst_y_w;
  int dst_h;
  int dst_w;
  int src_y_w;
  int src_h;
  int src_w;
  int is_uv;
  int i;
  int malloc_failed;
  _Bool has_normative_scaler;
  int16_t *in_stack_00000130;
  uint8_t *in_stack_00000138;
  int in_stack_0000016c;
  int in_stack_00000170;
  int in_stack_00000174;
  uint8_t *in_stack_00000178;
  int in_stack_00000184;
  uint8_t *in_stack_00000188;
  int16_t *in_stack_00000200;
  uint8_t *in_stack_00000208;
  InterpKernel *in_stack_00000510;
  int in_stack_00000518;
  uint8_t *in_stack_00000520;
  int16_t *in_stack_fffffffffffffe88;
  int num_planes_00;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffe90;
  int local_158;
  int local_14c;
  _Bool local_141;
  int16_t *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  uint in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int16_t *in_stack_fffffffffffffef8;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  uint8_t *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  ushort in_stack_ffffffffffffff66;
  InterpFilter filter_00;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar7;
  undefined3 in_stack_ffffffffffffff9c;
  undefined4 uVar8;
  char cVar9;
  undefined4 in_stack_ffffffffffffffb0;
  ushort in_stack_ffffffffffffffb6;
  uint8_t *in_stack_ffffffffffffffb8;
  ptrdiff_t in_stack_ffffffffffffffc0;
  ushort in_stack_ffffffffffffffc8;
  ushort in_stack_ffffffffffffffca;
  ushort in_stack_ffffffffffffffcc;
  ushort in_stack_ffffffffffffffce;
  long in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  ushort in_stack_fffffffffffffff0;
  ushort in_stack_fffffffffffffff2;
  ushort in_stack_fffffffffffffff4;
  ushort in_stack_fffffffffffffff6;
  ushort in_stack_fffffffffffffffc;
  ushort in_stack_fffffffffffffffe;
  
  uVar8 = CONCAT13(in_DL,in_stack_ffffffffffffff9c);
  _Var4 = has_normative_scaler_ssse3
                    (*(int *)(in_RDI + 0x10),*(int *)(in_RDI + 0x18),*(int *)(in_RSI + 0x10),
                     *(int *)(in_RSI + 0x18));
  uVar7 = CONCAT13(_Var4,(int3)in_stack_ffffffffffffff90);
  local_158 = in_stack_fffffffffffffee8;
  if (1 < in_R8D) {
    local_141 = false;
    if (_Var4) {
      local_141 = has_normative_scaler_ssse3
                            (*(int *)(in_RDI + 0x14),*(int *)(in_RDI + 0x1c),*(int *)(in_RSI + 0x14)
                             ,*(int *)(in_RSI + 0x1c));
    }
    uVar7 = CONCAT13(local_141,(int3)uVar7);
    local_158 = in_stack_fffffffffffffee8;
  }
  if ((char)((uint)uVar7 >> 0x18) == '\0') {
    av1_resize_and_extend_frame_c
              ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (InterpFilter)(in_stack_ffffffffffffff66 >> 8),in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c);
    return;
  }
  bVar3 = false;
  local_78 = 0;
  do {
    num_planes_00 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    filter_00 = (InterpFilter)(in_stack_ffffffffffffff66 >> 8);
    local_14c = in_R8D;
    if (2 < in_R8D) {
      local_14c = 3;
    }
    if (local_14c <= local_78) goto LAB_007b3f35;
    uVar5 = (uint)(0 < local_78);
    iVar1 = *(int *)(in_RDI + 0x10 + (long)(int)uVar5 * 4);
    iVar2 = *(int *)(in_RDI + 0x18 + (long)(int)uVar5 * 4);
    in_stack_ffffffffffffff74 = *(int *)(in_RSI + 0x10 + (long)(int)uVar5 * 4);
    in_stack_ffffffffffffff70 = *(int *)(in_RSI + 0x18 + (long)(int)uVar5 * 4);
    in_stack_ffffffffffffff6c = *(int *)(in_RSI + 0x10) + 1U & 0xfffffffe;
    in_stack_ffffffffffffff68 = *(int *)(in_RSI + 0x18) + 1U & 0xfffffffe;
    cVar9 = (char)((uint)uVar8 >> 0x18);
    if ((in_stack_ffffffffffffff74 << 1 == iVar1) && (in_stack_ffffffffffffff70 << 1 == iVar2)) {
      if (in_ECX == 0) {
        scale_plane_2_to_1_phase_0
                  ((uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   CONCAT44(in_stack_fffffffffffffeec,local_158),
                   (uint8_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (ptrdiff_t)in_stack_fffffffffffffed8,
                   (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0);
      }
      else if (cVar9 == '\x03') {
        in_stack_ffffffffffffff66 = av1_bilinear_filters[in_ECX][3];
        in_stack_ffffffffffffffb6 = in_stack_ffffffffffffff66 | av1_bilinear_filters[in_ECX][4] << 8
        ;
        in_stack_ffffffffffffffb8 =
             (uint8_t *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb6,
                               CONCAT22(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb6)));
        in_stack_ffffffffffffffc0 =
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT24(in_stack_ffffffffffffffb6,
                               CONCAT22(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb6)));
        c0c1_00[0]._4_4_ = in_stack_fffffffffffffee4;
        c0c1_00[0]._0_4_ = in_stack_fffffffffffffee0;
        c0c1_00[1]._0_4_ = local_158;
        c0c1_00[1]._4_4_ = in_stack_fffffffffffffeec;
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffb6;
        in_stack_ffffffffffffffca = in_stack_ffffffffffffffb6;
        in_stack_ffffffffffffffcc = in_stack_ffffffffffffffb6;
        in_stack_ffffffffffffffce = in_stack_ffffffffffffffb6;
        scale_plane_2_to_1_bilinear
                  (in_stack_ffffffffffffff18,
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (ptrdiff_t)in_stack_ffffffffffffff00,
                   (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8,
                   c0c1_00);
      }
      else {
        pYVar6 = (YV12_BUFFER_CONFIG *)
                 malloc((long)(int)((in_stack_ffffffffffffff6c + 3 & 0xfffffffc) *
                                   (in_stack_ffffffffffffff68 * 2 + 0xd & 0xfffffff8)));
        filter_00 = (InterpFilter)(in_stack_ffffffffffffff66 >> 8);
        if (pYVar6 == (YV12_BUFFER_CONFIG *)0x0) {
          bVar3 = true;
          goto LAB_007b3f35;
        }
        in_stack_fffffffffffffe88 =
             av1_interp_filter_params_list[(byte)((uint)uVar8 >> 0x18)].filter_ptr +
             (long)in_ECX * 8;
        in_stack_fffffffffffffe90 = pYVar6;
        scale_plane_2_to_1_general
                  ((uint8_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                   CONCAT22(in_stack_fffffffffffffffe,in_stack_fffffffffffffffc),
                   (uint8_t *)
                   CONCAT26(in_stack_fffffffffffffff6,
                            CONCAT24(in_stack_fffffffffffffff4,
                                     CONCAT22(in_stack_fffffffffffffff2,in_stack_fffffffffffffff0)))
                   ,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),in_stack_00000130,
                   in_stack_00000138);
        free(pYVar6);
      }
    }
    else if ((in_stack_ffffffffffffff74 << 2 == iVar1) && (in_stack_ffffffffffffff70 << 2 == iVar2))
    {
      if (in_ECX == 0) {
        scale_plane_4_to_1_phase_0
                  ((uint8_t *)in_stack_fffffffffffffef8,
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (uint8_t *)CONCAT44(in_stack_fffffffffffffeec,local_158),
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8);
      }
      else if (cVar9 == '\x03') {
        in_stack_fffffffffffffff0 =
             av1_bilinear_filters[in_ECX][3] | av1_bilinear_filters[in_ECX][4] << 8;
        in_stack_ffffffffffffff18 =
             (uint8_t *)
             CONCAT26(in_stack_fffffffffffffff0,
                      CONCAT24(in_stack_fffffffffffffff0,
                               CONCAT22(in_stack_fffffffffffffff0,in_stack_fffffffffffffff0)));
        in_stack_ffffffffffffffe0 =
             (ulong)CONCAT22(in_stack_fffffffffffffff0,in_stack_fffffffffffffff0) << 0x20;
        c0c1_01[0]._4_4_ = in_R8D;
        c0c1_01[0]._0_4_ = uVar7;
        c0c1_01[1]._0_4_ = in_ECX;
        c0c1_01[1]._4_4_ = uVar8;
        in_stack_fffffffffffffff2 = in_stack_fffffffffffffff0;
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff0;
        in_stack_fffffffffffffff6 = in_stack_fffffffffffffff0;
        in_stack_fffffffffffffffc = in_stack_fffffffffffffff0;
        in_stack_fffffffffffffffe = in_stack_fffffffffffffff0;
        scale_plane_4_to_1_bilinear
                  ((uint8_t *)
                   CONCAT26(in_stack_ffffffffffffffce,
                            CONCAT24(in_stack_ffffffffffffffcc,
                                     CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8)))
                   ,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   CONCAT26(in_stack_ffffffffffffffb6,
                            CONCAT24(in_stack_fffffffffffffff0,in_stack_ffffffffffffffb0)),
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,c0c1_01);
      }
      else {
        in_stack_ffffffffffffff10 = in_stack_ffffffffffffff68 * 4 + 8;
        in_stack_ffffffffffffff0c = 0x10;
        uVar5 = in_stack_ffffffffffffff6c;
        pYVar6 = (YV12_BUFFER_CONFIG *)
                 malloc((long)(int)(in_stack_ffffffffffffff6c * in_stack_ffffffffffffff10 + 0x10));
        filter_00 = (InterpFilter)(in_stack_ffffffffffffff66 >> 8);
        if (pYVar6 == (YV12_BUFFER_CONFIG *)0x0) {
          bVar3 = true;
          in_stack_ffffffffffffff6c = uVar5;
          goto LAB_007b3f35;
        }
        in_stack_fffffffffffffef8 =
             av1_interp_filter_params_list[(byte)((uint)uVar8 >> 0x18)].filter_ptr;
        in_stack_fffffffffffffe88 = in_stack_fffffffffffffef8 + (long)in_ECX * 8;
        in_stack_ffffffffffffff00 = pYVar6;
        scale_plane_4_to_1_general
                  ((uint8_t *)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
                   in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                   CONCAT22(in_stack_fffffffffffffffe,in_stack_fffffffffffffffc),in_stack_000000d0,
                   in_stack_000000d8);
        free(in_stack_ffffffffffffff00);
        in_stack_fffffffffffffe90 = pYVar6;
        in_stack_ffffffffffffff14 = in_stack_ffffffffffffff6c;
        in_stack_ffffffffffffff6c = uVar5;
      }
    }
    else if ((in_stack_ffffffffffffff74 << 2 == iVar1 * 3) &&
            (in_stack_ffffffffffffff70 << 2 == iVar2 * 3)) {
      in_stack_fffffffffffffef4 =
           (in_stack_ffffffffffffff6c - (int)(in_stack_ffffffffffffff6c + 5) % 6) + 7;
      in_stack_fffffffffffffef0 = in_stack_ffffffffffffff6c + 7 & 0xfffffff8;
      in_stack_fffffffffffffeec = (int)(in_stack_ffffffffffffff68 << 2) / 3 + 0xeU & 0xfffffff8;
      if (in_stack_fffffffffffffef4 < (int)in_stack_fffffffffffffef0) {
        local_158 = (in_stack_fffffffffffffef0 - in_stack_fffffffffffffef4) * 2;
      }
      else {
        local_158 = 0;
      }
      in_stack_fffffffffffffee4 = in_stack_fffffffffffffef4 * in_stack_fffffffffffffeec + local_158;
      in_stack_fffffffffffffed8 = malloc((long)in_stack_fffffffffffffee4);
      filter_00 = (InterpFilter)(in_stack_ffffffffffffff66 >> 8);
      if (in_stack_fffffffffffffed8 == (void *)0x0) {
        bVar3 = true;
LAB_007b3f35:
        if (bVar3) {
          av1_resize_and_extend_frame_c
                    ((YV12_BUFFER_CONFIG *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (YV12_BUFFER_CONFIG *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),filter_00,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          return;
        }
        aom_extend_frame_borders_c(in_stack_fffffffffffffe90,num_planes_00);
        return;
      }
      in_stack_fffffffffffffe88 =
           av1_interp_filter_params_list[(byte)((uint)uVar8 >> 0x18)].filter_ptr;
      in_stack_fffffffffffffe90 =
           (YV12_BUFFER_CONFIG *)CONCAT44((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),in_ECX);
      in_stack_fffffffffffffed0 = in_stack_fffffffffffffe88;
      scale_plane_4_to_3_general
                (in_stack_00000188,in_stack_00000184,in_stack_00000178,in_stack_00000174,
                 in_stack_00000170,in_stack_0000016c,in_stack_00000510,in_stack_00000518,
                 in_stack_00000520);
      free(in_stack_fffffffffffffed8);
    }
    else {
      pYVar6 = (YV12_BUFFER_CONFIG *)
               malloc((long)(int)(((*(int *)(in_RDI + 0x10) + 1U & 0xfffffffe) + 7 & 0xfffffff8) <<
                                 3));
      filter_00 = (InterpFilter)(in_stack_ffffffffffffff66 >> 8);
      if (pYVar6 == (YV12_BUFFER_CONFIG *)0x0) {
        bVar3 = true;
        goto LAB_007b3f35;
      }
      in_stack_fffffffffffffe88 =
           av1_interp_filter_params_list[(byte)((uint)uVar8 >> 0x18)].filter_ptr + 0x40;
      in_stack_fffffffffffffe90 = pYVar6;
      scale_plane_1_to_2_phase_0
                ((uint8_t *)interp_kernel_3,in_stack_00000030,in_stack_00000028,in_stack_00000020,
                 in_stack_0000001c,in_stack_00000018,in_stack_00000200,in_stack_00000208);
      free(pYVar6);
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void av1_resize_and_extend_frame_ssse3(const YV12_BUFFER_CONFIG *src,
                                       YV12_BUFFER_CONFIG *dst,
                                       const InterpFilter filter,
                                       const int phase, const int num_planes) {
  bool has_normative_scaler =
      has_normative_scaler_ssse3(src->y_crop_width, src->y_crop_height,
                                 dst->y_crop_width, dst->y_crop_height);

  if (num_planes > 1) {
    has_normative_scaler =
        has_normative_scaler &&
        has_normative_scaler_ssse3(src->uv_crop_width, src->uv_crop_height,
                                   dst->uv_crop_width, dst->uv_crop_height);
  }

  if (!has_normative_scaler) {
    av1_resize_and_extend_frame_c(src, dst, filter, phase, num_planes);
    return;
  }

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  int malloc_failed = 0;
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
    const int src_w = src->crop_widths[is_uv];
    const int src_h = src->crop_heights[is_uv];
    const int src_y_w = (src->crop_widths[0] + 1) & ~1;
    const int dst_w = dst->crop_widths[is_uv];
    const int dst_h = dst->crop_heights[is_uv];
    const int dst_y_w = (dst->crop_widths[0] + 1) & ~1;
    const int dst_y_h = (dst->crop_heights[0] + 1) & ~1;

    if (2 * dst_w == src_w && 2 * dst_h == src_h) {
      // 2 to 1
      if (phase == 0) {
        scale_plane_2_to_1_phase_0(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h);
      } else if (filter == BILINEAR) {
        const int16_t c0 = av1_bilinear_filters[phase][3];
        const int16_t c1 = av1_bilinear_filters[phase][4];
        const __m128i c0c1 = _mm_set1_epi16(c0 | (c1 << 8));  // c0 and c1 >= 0
        scale_plane_2_to_1_bilinear(src->buffers[i], src->strides[is_uv],
                                    dst->buffers[i], dst->strides[is_uv], dst_w,
                                    dst_h, c0c1);
      } else {
        const int buffer_stride = (dst_y_w + 3) & ~3;
        const int buffer_height = (2 * dst_y_h + SUBPEL_TAPS - 2 + 7) & ~7;
        uint8_t *const temp_buffer =
            (uint8_t *)malloc(buffer_stride * buffer_height);
        if (!temp_buffer) {
          malloc_failed = 1;
          break;
        }
        const InterpKernel *interp_kernel =
            (const InterpKernel *)av1_interp_filter_params_list[filter]
                .filter_ptr;
        scale_plane_2_to_1_general(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h, interp_kernel[phase], temp_buffer);
        free(temp_buffer);
      }
    } else if (4 * dst_w == src_w && 4 * dst_h == src_h) {
      // 4 to 1
      if (phase == 0) {
        scale_plane_4_to_1_phase_0(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h);
      } else if (filter == BILINEAR) {
        const int16_t c0 = av1_bilinear_filters[phase][3];
        const int16_t c1 = av1_bilinear_filters[phase][4];
        const __m128i c0c1 = _mm_set1_epi16(c0 | (c1 << 8));  // c0 and c1 >= 0
        scale_plane_4_to_1_bilinear(src->buffers[i], src->strides[is_uv],
                                    dst->buffers[i], dst->strides[is_uv], dst_w,
                                    dst_h, c0c1);
      } else {
        const int buffer_stride = (dst_y_w + 1) & ~1;
        const int buffer_height = (4 * dst_y_h + SUBPEL_TAPS - 2 + 7) & ~7;
        // When dst_w is 1 or 2, we need extra padding to avoid heap read
        // overflow
        const int extra_padding = 16;
        uint8_t *const temp_buffer =
            (uint8_t *)malloc(buffer_stride * buffer_height + extra_padding);
        if (!temp_buffer) {
          malloc_failed = 1;
          break;
        }
        const InterpKernel *interp_kernel =
            (const InterpKernel *)av1_interp_filter_params_list[filter]
                .filter_ptr;
        scale_plane_4_to_1_general(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h, interp_kernel[phase], temp_buffer);
        free(temp_buffer);
      }
    } else if (4 * dst_w == 3 * src_w && 4 * dst_h == 3 * src_h) {
      // 4 to 3
      const int buffer_stride_hor = (dst_y_w + 5) - ((dst_y_w + 5) % 6) + 2;
      const int buffer_stride_ver = (dst_y_w + 7) & ~7;
      const int buffer_height = (4 * dst_y_h / 3 + SUBPEL_TAPS - 1 + 7) & ~7;
      // When the vertical filter reads more pixels than the horizontal filter
      // generated in each row, we need extra padding to avoid heap read
      // overflow. For example, the horizontal filter generates 18 pixels but
      // the vertical filter reads 24 pixels in a row. The difference is
      // multiplied by 2 since two rows are interlaced together in the
      // optimization.
      const int extra_padding =
          (buffer_stride_ver > buffer_stride_hor)
              ? 2 * (buffer_stride_ver - buffer_stride_hor)
              : 0;
      const int buffer_size = buffer_stride_hor * buffer_height + extra_padding;
      uint8_t *const temp_buffer = (uint8_t *)malloc(buffer_size);
      if (!temp_buffer) {
        malloc_failed = 1;
        break;
      }
      const InterpKernel *interp_kernel =
          (const InterpKernel *)av1_interp_filter_params_list[filter]
              .filter_ptr;
      scale_plane_4_to_3_general(src->buffers[i], src->strides[is_uv],
                                 dst->buffers[i], dst->strides[is_uv], dst_w,
                                 dst_h, interp_kernel, phase, temp_buffer);
      free(temp_buffer);
    } else {
      assert(dst_w == src_w * 2 && dst_h == src_h * 2);
      // 1 to 2
      uint8_t *const temp_buffer = (uint8_t *)malloc(8 * ((src_y_w + 7) & ~7));
      if (!temp_buffer) {
        malloc_failed = 1;
        break;
      }
      const InterpKernel *interp_kernel =
          (const InterpKernel *)av1_interp_filter_params_list[filter]
              .filter_ptr;
      scale_plane_1_to_2_phase_0(src->buffers[i], src->strides[is_uv],
                                 dst->buffers[i], dst->strides[is_uv], src_w,
                                 src_h, interp_kernel[8], temp_buffer);
      free(temp_buffer);
    }
  }

  if (malloc_failed) {
    av1_resize_and_extend_frame_c(src, dst, filter, phase, num_planes);
  } else {
    aom_extend_frame_borders(dst, num_planes);
  }
}